

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O0

uint32_t __thiscall
R10_Decoder::nonZeros_In_Row
          (R10_Decoder *this,
          vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *Row,uint32_t fromCol,uint32_t toCol)

{
  reference puVar1;
  undefined4 local_28;
  undefined4 local_24;
  int i;
  uint32_t r;
  uint32_t toCol_local;
  uint32_t fromCol_local;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *Row_local;
  R10_Decoder *this_local;
  
  local_24 = 0;
  for (local_28 = fromCol; local_28 <= toCol; local_28 = local_28 + 1) {
    puVar1 = boost::numeric::ublas::
             vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator()(Row,(long)(int)local_28);
    if (*puVar1 == '\x01') {
      local_24 = local_24 + 1;
    }
  }
  return local_24;
}

Assistant:

uint32_t R10_Decoder::nonZeros_In_Row(ublas::vector<uint8_t> Row, uint32_t fromCol, uint32_t toCol)
{
	uint32_t r = 0;
	for (int i = fromCol; i <= toCol; i++)
	{
		if (Row(i) == 1)
		{
			r++;
		}
	}

	return r;
}